

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * QUnicodeTables::detachAndConvertCase<QString>
                    (QString *__return_storage_ptr__,QString *str,QStringIterator it,Case which)

{
  const_iterator pQVar1;
  const_iterator pQVar2;
  char32_t uc;
  iterator pQVar3;
  byte bVar4;
  char16_t *pcVar5;
  long lVar6;
  long in_FS_OFFSET;
  R_conflict2 RVar7;
  QChar local_48 [4];
  undefined2 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&str->d);
  pQVar3 = QString::begin(__return_storage_ptr__);
  pcVar5 = (char16_t *)(((long)it.pos - (long)it.i) + (long)pQVar3);
  do {
    local_48 = (QChar  [4])&DAT_aaaaaaaaaaaaaaaa;
    local_40 = 0xaaaa;
    uc = QStringIterator::next(&it,L'�');
    RVar7 = fullConvertCase(uc,which);
    pQVar2 = it.pos;
    pQVar1 = it.i;
    local_48 = (QChar  [4])RVar7.chars;
    bVar4 = RVar7.sz;
    local_40 = CONCAT11(local_40._1_1_,bVar4);
    if ((char)bVar4 < '\x02') {
      *pcVar5 = RVar7.chars[0];
      pcVar5 = pcVar5 + 1;
    }
    else if ((bVar4 == 2) && (*pcVar5 == RVar7.chars[0])) {
      pcVar5[1] = RVar7.chars[1];
      pcVar5 = pcVar5 + 2;
    }
    else {
      lVar6 = (long)pcVar5 - (long)(__return_storage_ptr__->d).ptr;
      QString::replace(__return_storage_ptr__,lVar6 >> 1,1,local_48,(ulong)bVar4);
      it.i = (const_iterator)(__return_storage_ptr__->d).ptr;
      pcVar5 = (char16_t *)((long)it.i + (long)(char)local_40 * 2 + lVar6);
      it.e = it.i + (__return_storage_ptr__->d).size;
      it.pos = (const_iterator)
               ((long)it.i + (long)pQVar2 + ((long)(char)local_40 * 2 - (long)pQVar1) + -2);
    }
  } while (it.pos < it.e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE
static QString detachAndConvertCase(T &str, QStringIterator it, QUnicodeTables::Case which)
{
    Q_ASSERT(!str.isEmpty());
    QString s = std::move(str);         // will copy if T is const QString
    QChar *pp = s.begin() + it.index(); // will detach if necessary

    do {
        const auto folded = fullConvertCase(it.next(), which);
        if (Q_UNLIKELY(folded.size() > 1)) {
            if (folded.chars[0] == *pp && folded.size() == 2) {
                // special case: only second actually changed (e.g. surrogate pairs),
                // avoid slow case
                ++pp;
                *pp++ = folded.chars[1];
            } else {
                // slow path: the string is growing
                qsizetype inpos = it.index() - 1;
                qsizetype outpos = pp - s.constBegin();

                s.replace(outpos, 1, reinterpret_cast<const QChar *>(folded.data()), folded.size());
                pp = const_cast<QChar *>(s.constBegin()) + outpos + folded.size();

                // Adjust the input iterator if we are performing an in-place conversion
                if constexpr (!std::is_const<T>::value)
                    it = QStringIterator(s.constBegin(), inpos + folded.size(), s.constEnd());
            }
        } else {
            *pp++ = folded.chars[0];
        }
    } while (it.hasNext());

    return s;
}